

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix_tree.cpp
# Opt level: O3

void __thiscall
wasm::SuffixTreeTest_TestSingleCharacterRepeat_Test::TestBody
          (SuffixTreeTest_TestSingleCharacterRepeat_Test *this)

{
  int *piVar1;
  uint *puVar2;
  char *pcVar3;
  ulong uVar4;
  int *expected_predicate_value;
  difference_type __d;
  ulong uVar5;
  int *piVar6;
  long lVar7;
  pointer puVar8;
  initializer_list<unsigned_int> __l;
  void *pvStack_228;
  SuffixTree ST;
  undefined4 auStack_210 [26];
  SpecificBumpPtrAllocator<wasm::SuffixTreeLeafNode> local_1a8 [104];
  SuffixTreeInternalNode *local_140;
  RepeatedSubstringIterator local_118;
  void *local_d0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> RepeatedRepetitionData;
  vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
  SubStrings;
  undefined1 local_98 [8];
  iterator It;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  AssertHelper local_38;
  
  auStack_210[0] = 2;
  pvStack_228 = (void *)0x100000001;
  _ST = 1;
  __l._M_len = 7;
  __l._M_array = (iterator)&pvStack_228;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_d0,__l,
             (allocator_type *)local_98);
  ::wasm::SuffixTree::SuffixTree((SuffixTree *)&pvStack_228,(vector *)&local_d0);
  RepeatedRepetitionData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  SuffixTree::RepeatedSubstringIterator::RepeatedSubstringIterator
            ((RepeatedSubstringIterator *)local_98,local_140);
  if (CONCAT71(local_98._1_7_,local_98[0]) != 0) {
    do {
      std::
      vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
      ::push_back((vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
                   *)&RepeatedRepetitionData.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,(value_type *)&It);
      SuffixTree::RepeatedSubstringIterator::operator++
                (&local_118,(RepeatedSubstringIterator *)local_98,0);
      if (local_118.InternalNodesToVisit.
          super__Vector_base<wasm::SuffixTreeInternalNode_*,_std::allocator<wasm::SuffixTreeInternalNode_*>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_118.InternalNodesToVisit.
                        super__Vector_base<wasm::SuffixTreeInternalNode_*,_std::allocator<wasm::SuffixTreeInternalNode_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_118.InternalNodesToVisit.
                              super__Vector_base<wasm::SuffixTreeInternalNode_*,_std::allocator<wasm::SuffixTreeInternalNode_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_118.InternalNodesToVisit.
                              super__Vector_base<wasm::SuffixTreeInternalNode_*,_std::allocator<wasm::SuffixTreeInternalNode_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_118.RS.StartIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_118.RS.StartIndices.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_118.RS.StartIndices.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_118.RS.StartIndices.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    } while (CONCAT71(local_98._1_7_,local_98[0]) != 0);
  }
  if (It.RS.StartIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(It.RS.StartIndices.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                    (long)It.InternalNodesToVisit.
                          super__Vector_base<wasm::SuffixTreeInternalNode_*,_std::allocator<wasm::SuffixTreeInternalNode_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)It.RS.StartIndices.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
  }
  if (It.RS._0_8_ != 0) {
    operator_delete((void *)It.RS._0_8_,
                    (long)It.RS.StartIndices.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_finish - It.RS._0_8_);
  }
  local_48._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (-(long)RepeatedRepetitionData.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage >> 5);
  local_38.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
            ((internal *)local_98,"SubStrings.size()","1u",(unsigned_long *)&local_48,
             (uint *)&local_38);
  if (local_98[0] == (allocator_type)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (It.N == (SuffixTreeNode *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)It.N;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/suffix_tree.cpp"
               ,0x5f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (local_48._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_48._M_head_impl + 8))();
    }
  }
  if (It.N != (SuffixTreeNode *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&It,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)It.N);
  }
  if (RepeatedRepetitionData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    puVar8 = RepeatedRepetitionData.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
    do {
      local_48._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (*(long *)(puVar8 + 4) - *(long *)(puVar8 + 2) >> 2);
      local_38.data_ =
           (AssertHelperData *)
           (((long)RepeatedRepetitionData.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start - (long)local_d0 >> 2) - (ulong)*puVar8);
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)local_98,"RS.StartIndices.size()",
                 "RepeatedRepetitionData.size() - RS.Length",(unsigned_long *)&local_48,
                 (unsigned_long *)&local_38);
      if (local_98[0] == (allocator_type)0x0) {
        testing::Message::Message((Message *)&local_48);
        pcVar3 = "";
        if (It.N != (SuffixTreeNode *)0x0) {
          pcVar3 = *(char **)It.N;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_38,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/suffix_tree.cpp"
                   ,0x62,pcVar3);
        testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_48);
        testing::internal::AssertHelper::~AssertHelper(&local_38);
        if (local_48._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_48._M_head_impl + 8))();
        }
      }
      if (It.N != (SuffixTreeNode *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&It,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            It.N);
      }
      for (puVar2 = *(uint **)(RepeatedRepetitionData.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage + 2);
          puVar2 != *(uint **)(RepeatedRepetitionData.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage + 4);
          puVar2 = puVar2 + 1) {
        uVar5 = (ulong)*puVar2;
        expected_predicate_value = (int *)((long)local_d0 + uVar5 * 4);
        uVar4 = (ulong)(*RepeatedRepetitionData.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + *puVar2);
        piVar1 = (int *)((long)local_d0 + uVar4 * 4);
        uVar4 = uVar4 * 4 + uVar5 * -4;
        if (0 < (long)uVar4 >> 4) {
          expected_predicate_value =
               (int *)((long)expected_predicate_value + (uVar4 & 0xfffffffffffffff0));
          lVar7 = ((long)uVar4 >> 4) + 1;
          piVar6 = (int *)((long)local_d0 + uVar5 * 4 + 8);
          do {
            if (piVar6[-2] != 1) {
              piVar6 = piVar6 + -2;
              goto LAB_001ce4db;
            }
            if (piVar6[-1] != 1) {
              piVar6 = piVar6 + -1;
              goto LAB_001ce4db;
            }
            if (*piVar6 != 1) goto LAB_001ce4db;
            if (piVar6[1] != 1) {
              piVar6 = piVar6 + 1;
              goto LAB_001ce4db;
            }
            lVar7 = lVar7 + -1;
            piVar6 = piVar6 + 4;
          } while (1 < lVar7);
          uVar4 = (long)piVar1 - (long)expected_predicate_value;
        }
        lVar7 = (long)uVar4 >> 2;
        if (lVar7 == 1) {
LAB_001ce4be:
          piVar6 = expected_predicate_value;
          if (*expected_predicate_value == 1) {
            expected_predicate_value = piVar1;
            piVar6 = piVar1;
          }
LAB_001ce4db:
          local_48._M_head_impl._1_7_ = (undefined7)((ulong)local_48._M_head_impl >> 8);
          local_48._M_head_impl._0_1_ = piVar6 == piVar1;
          local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (piVar6 != piVar1) {
            testing::Message::Message((Message *)&local_38);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_98,(internal *)&local_48,
                       (AssertionResult *)
                       "all_of(make_range<std::vector<unsigned>::iterator>(RRDIt, RRDIt2), [](unsigned Elt) { return Elt == 1; })"
                       ,"false","true",(char *)expected_predicate_value);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&It.MinLength,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/suffix_tree.cpp"
                       ,0x69,(char *)CONCAT71(local_98._1_7_,local_98[0]));
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&It.MinLength,(Message *)&local_38);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&It.MinLength);
            if ((RepeatedSubstring *)CONCAT71(local_98._1_7_,local_98[0]) != &It.RS) {
              operator_delete((undefined1 *)CONCAT71(local_98._1_7_,local_98[0]),It.RS._0_8_ + 1);
            }
            if (local_38.data_ != (AssertHelperData *)0x0) {
              (**(code **)(*(long *)local_38.data_ + 8))();
            }
            if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_40,local_40);
            }
            goto LAB_001ce5aa;
          }
        }
        else {
          if (lVar7 == 2) {
LAB_001ce4b4:
            piVar6 = expected_predicate_value;
            if (*expected_predicate_value == 1) {
              expected_predicate_value = expected_predicate_value + 1;
              goto LAB_001ce4be;
            }
            goto LAB_001ce4db;
          }
          if (lVar7 == 3) {
            piVar6 = expected_predicate_value;
            if (*expected_predicate_value == 1) {
              expected_predicate_value = expected_predicate_value + 1;
              goto LAB_001ce4b4;
            }
            goto LAB_001ce4db;
          }
        }
      }
      puVar8 = puVar8 + 8;
    } while (puVar8 != (uint *)0x0);
  }
LAB_001ce5aa:
  std::
  vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
  ::~vector((vector<wasm::SuffixTree::RepeatedSubstring,_std::allocator<wasm::SuffixTree::RepeatedSubstring>_>
             *)&RepeatedRepetitionData.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  llvm::SpecificBumpPtrAllocator<wasm::SuffixTreeLeafNode>::~SpecificBumpPtrAllocator(local_1a8);
  llvm::SpecificBumpPtrAllocator<wasm::SuffixTreeInternalNode>::~SpecificBumpPtrAllocator
            ((SpecificBumpPtrAllocator<wasm::SuffixTreeInternalNode> *)auStack_210);
  if (pvStack_228 != (void *)0x0) {
    operator_delete(pvStack_228,0x100000001 - (long)pvStack_228);
  }
  if (local_d0 != (void *)0x0) {
    operator_delete(local_d0,(long)RepeatedRepetitionData.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - (long)local_d0);
  }
  return;
}

Assistant:

TEST(SuffixTreeTest, TestSingleCharacterRepeat) {
  std::vector<unsigned> RepeatedRepetitionData = {1, 1, 1, 1, 1, 1, 2};
  std::vector<unsigned>::iterator RRDIt, RRDIt2;
  SuffixTree ST(RepeatedRepetitionData);
  std::vector<SuffixTree::RepeatedSubstring> SubStrings;
  for (auto It = ST.begin(); It != ST.end(); It++)
    SubStrings.push_back(*It);
  EXPECT_EQ(SubStrings.size(), 1u);
  for (SuffixTree::RepeatedSubstring& RS : SubStrings) {
    EXPECT_EQ(RS.StartIndices.size(),
              RepeatedRepetitionData.size() - RS.Length);
    for (unsigned StartIdx : SubStrings[0].StartIndices) {
      RRDIt = RRDIt2 = RepeatedRepetitionData.begin();
      std::advance(RRDIt, StartIdx);
      std::advance(RRDIt2, StartIdx + SubStrings[0].Length);
      ASSERT_TRUE(
        all_of(make_range<std::vector<unsigned>::iterator>(RRDIt, RRDIt2),
               [](unsigned Elt) { return Elt == 1; }));
    }
  }
}